

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomes.c
# Opt level: O0

int getMutated(int mc,int id)

{
  int id_local;
  int mc_local;
  int local_4;
  
  switch(id) {
  case 1:
    local_4 = 0x81;
    break;
  case 2:
    local_4 = 0x82;
    break;
  case 3:
    local_4 = 0x83;
    break;
  case 4:
    local_4 = 0x84;
    break;
  case 5:
    local_4 = 0x85;
    break;
  case 6:
    local_4 = 0x86;
    break;
  default:
    local_4 = -1;
    break;
  case 0xc:
    local_4 = 0x8c;
    break;
  case 0x15:
    local_4 = 0x95;
    break;
  case 0x17:
    local_4 = 0x97;
    break;
  case 0x1b:
    local_4 = 0x9b;
    if (0xb < mc && mc < 0xe) {
      local_4 = 0x9c;
    }
    break;
  case 0x1c:
    local_4 = 0x9c;
    if (0xb < mc && mc < 0xe) {
      local_4 = -1;
    }
    break;
  case 0x1d:
    local_4 = 0x9d;
    break;
  case 0x1e:
    local_4 = 0x9e;
    break;
  case 0x20:
    local_4 = 0xa0;
    break;
  case 0x21:
    local_4 = 0xa1;
    break;
  case 0x22:
    local_4 = 0xa2;
    break;
  case 0x23:
    local_4 = 0xa3;
    break;
  case 0x24:
    local_4 = 0xa4;
    break;
  case 0x25:
    local_4 = 0xa5;
    break;
  case 0x26:
    local_4 = 0xa6;
    break;
  case 0x27:
    local_4 = 0xa7;
  }
  return local_4;
}

Assistant:

int getMutated(int mc, int id)
{
    switch (id)
    {
    case plains:                    return sunflower_plains;
    case desert:                    return desert_lakes;
    case mountains:                 return gravelly_mountains;
    case forest:                    return flower_forest;
    case taiga:                     return taiga_mountains;
    case swamp:                     return swamp_hills;
    case snowy_tundra:              return ice_spikes;
    case jungle:                    return modified_jungle;
    case jungle_edge:               return modified_jungle_edge;
    // emulate MC-98995
    case birch_forest:
        return (mc >= MC_1_9 && mc <= MC_1_10) ? tall_birch_hills : tall_birch_forest;
    case birch_forest_hills:
        return (mc >= MC_1_9 && mc <= MC_1_10) ? none : tall_birch_hills;
    case dark_forest:               return dark_forest_hills;
    case snowy_taiga:               return snowy_taiga_mountains;
    case giant_tree_taiga:          return giant_spruce_taiga;
    case giant_tree_taiga_hills:    return giant_spruce_taiga_hills;
    case wooded_mountains:          return modified_gravelly_mountains;
    case savanna:                   return shattered_savanna;
    case savanna_plateau:           return shattered_savanna_plateau;
    case badlands:                  return eroded_badlands;
    case wooded_badlands_plateau:   return modified_wooded_badlands_plateau;
    case badlands_plateau:          return modified_badlands_plateau;
    default:
        return none;
    }
}